

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithms.h
# Opt level: O3

value_t __thiscall
pmean_filtration::compute_filtration
          (pmean_filtration *this,unsigned_short dimension,directed_flag_complex_cell_t *param_2,
          filtered_directed_graph_t *param_3,value_t *boundary_filtration)

{
  long lVar1;
  undefined2 in_register_00000032;
  float fVar2;
  float fVar3;
  
  fVar2 = 0.0;
  lVar1 = 0;
  do {
    fVar3 = boundary_filtration[lVar1];
    if ((lVar1 != 0) && (fVar3 <= fVar2)) {
      fVar3 = fVar2;
    }
    fVar2 = fVar3;
    lVar1 = lVar1 + 1;
  } while ((ulong)CONCAT22(in_register_00000032,dimension) + 1 != lVar1);
  fVar3 = 0.0;
  lVar1 = 0;
  do {
    fVar3 = fVar3 + boundary_filtration[lVar1] * boundary_filtration[lVar1];
    lVar1 = lVar1 + 1;
  } while ((ulong)(uint)dimension + 1 != lVar1);
  fVar3 = powf(fVar3,0.5);
  return fVar3 / ((float)dimension + 1.0) + fVar2;
}

Assistant:

virtual inline value_t compute_filtration(unsigned short dimension, const directed_flag_complex_cell_t&,
	                                          const filtered_directed_graph_t&,
	                                          const value_t* boundary_filtration) const {
		return (max(boundary_filtration, 0, dimension) +
		        pow(
		            [&]() {
			            value_t EXPRESSION_0 = 0.0f;
			            for (int COUNTER_A = (int)0; COUNTER_A <= (int)dimension; COUNTER_A++) {
				            EXPRESSION_0 += (pow(boundary_filtration[COUNTER_A], 2.0f));
			            }
			            return EXPRESSION_0;
		            }(),
		            (1.0f / 2.0f)) /
		            (dimension + 1.0f));
	}